

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Mesh::check_finite_positions(Mesh *this)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar1;
  _List_node_base *p_Var2;
  allocator local_59;
  Mesh *local_58;
  string local_50;
  
  if (this->alreadyCheckingPositions == false) {
    this->alreadyCheckingPositions = true;
    plVar1 = &(this->mesh).vertices;
    p_Var2 = (_List_node_base *)plVar1;
    local_58 = this;
    while (p_Var2 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)
                     &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var2 != (_List_node_base *)plVar1) {
      if (((0x7fefffffffffffff < ((ulong)p_Var2[1]._M_prev & 0x7fffffffffffffff)) ||
          (0x7fefffffffffffff < ((ulong)p_Var2[2]._M_next & 0x7fffffffffffffff))) ||
         (0x7fefffffffffffff < ((ulong)p_Var2[2]._M_prev & 0x7fffffffffffffff))) {
        std::__cxx11::string::string
                  ((string *)&local_50,"You set a vertex position to a non-finite value.",&local_59)
        ;
        showError(&local_50,true);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    local_58->alreadyCheckingPositions = false;
  }
  return;
}

Assistant:

void Mesh::check_finite_positions() {

  // If the error triggers below, the showError() routine will internally return
  // to the draw loop to enable the GUI, but that calls mesh.draw() again, which
  // can call this method again, resulting in an infinite loop. To avoid this,
  // ensure we don't recurse.
  if(alreadyCheckingPositions) {
    return;
  }
  alreadyCheckingPositions = true;

  // Check if all vertex positions are finite
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    Vector3D position = v->position;
    bool finite = std::isfinite(position.x) && std::isfinite(position.y) && std::isfinite(position.z);

    if(!finite) {
      showError("You set a vertex position to a non-finite value.", true);
    }
  }

  alreadyCheckingPositions = false;
}